

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voxelizer.h
# Opt level: O2

vx_mesh_t *
vx_voxelize(vx_mesh_t *m,float voxelsizex,float voxelsizey,float voxelsizez,float precision)

{
  vx_triangle_t triangle_00;
  bool bVar1;
  int iVar2;
  vx_hash_table_t *table;
  anon_union_12_2_12391dad_for_vx_vertex_0 *data;
  size_t sVar3;
  vx_mesh_t *mesh;
  vx_vertex_t *pvVar4;
  uint *puVar5;
  ulong uVar6;
  float *pfVar7;
  size_t i;
  size_t sVar8;
  vx_hash_table_node_t *pvVar9;
  long lVar10;
  byte bVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  anon_struct_12_3_4e92e0dd_for_anon_union_12_2_12391dad_for_vx_vertex_0_1 boxcenter;
  vx_vertex_t vVar24;
  vx_vertex_t halfboxsize;
  vx_aabb_t saabb;
  vx_triangle_t triangle;
  float local_98;
  float local_94;
  float fStack_90;
  float local_8c;
  float local_88;
  float local_84;
  float local_80;
  float local_7c;
  float local_78;
  float local_74;
  float local_70;
  float fStack_6c;
  ulong local_68;
  ulong uStack_60;
  float local_58;
  float fStack_54;
  float local_50;
  float local_4c;
  float fStack_48;
  float local_44;
  float local_40;
  float local_3c;
  
  bVar11 = 0;
  fVar23 = voxelsizex * 0.5;
  fVar13 = voxelsizey * 0.5;
  fVar20 = voxelsizez * 0.5;
  table = vx__hash_table_alloc(0x1000);
  lVar10 = 0;
  for (uVar6 = 0; uVar6 < m->nindices; uVar6 = uVar6 + 3) {
    pvVar4 = m->vertices;
    puVar5 = m->indices;
    triangle.p1.field_0.v[2] = pvVar4[puVar5[uVar6]].field_0.v[2];
    triangle.p1.field_0._0_8_ = *(undefined8 *)&pvVar4[puVar5[uVar6]].field_0;
    triangle.p2.field_0.v[0] = (float)*(undefined8 *)&pvVar4[puVar5[uVar6 + 1]].field_0;
    triangle.p2.field_0.v[1] =
         (float)((ulong)*(undefined8 *)&pvVar4[puVar5[uVar6 + 1]].field_0 >> 0x20);
    triangle.p2.field_0.v[2] = pvVar4[puVar5[uVar6 + 1]].field_0.v[2];
    triangle.p3.field_0._0_8_ = *(undefined8 *)&pvVar4[puVar5[uVar6 + 2]].field_0;
    triangle.p3.field_0.v[2] = pvVar4[puVar5[uVar6 + 2]].field_0.v[2];
    fVar14 = vx__triangle_area(&triangle);
    if (1e-07 <= fVar14) {
      vx__triangle_aabb(&triangle);
      fVar14 = local_94;
      fVar15 = floorf(((float)(~-(uint)(local_98 < 0.0) & (uint)voxelsizex |
                              -(uint)(local_98 < 0.0) & (uint)-voxelsizex) * 0.5 + local_98) /
                      voxelsizex);
      uVar12 = -(uint)(fVar14 < 0.0);
      fVar14 = floorf(((float)(~uVar12 & (uint)voxelsizey | uVar12 & (uint)-voxelsizey) * 0.5 +
                      fVar14) / voxelsizey);
      fVar16 = floorf(((float)(~-(uint)(fStack_90 < 0.0) & (uint)voxelsizez |
                              -(uint)(fStack_90 < 0.0) & (uint)-voxelsizez) * 0.5 + fStack_90) /
                      voxelsizez);
      fVar17 = ceilf(((float)(~-(uint)(local_8c < 0.0) & (uint)voxelsizex |
                             -(uint)(local_8c < 0.0) & (uint)-voxelsizex) * 0.5 + local_8c) /
                     voxelsizex);
      fVar18 = ceilf(((float)(~-(uint)(local_88 < 0.0) & (uint)voxelsizey |
                             -(uint)(local_88 < 0.0) & (uint)-voxelsizey) * 0.5 + local_88) /
                     voxelsizey);
      fVar19 = ceilf(((float)(~-(uint)(local_84 < 0.0) & (uint)voxelsizez |
                             -(uint)(local_84 < 0.0) & (uint)-voxelsizez) * 0.5 + local_84) /
                     voxelsizez);
      for (fVar15 = fVar15 * voxelsizex; fVar15 < fVar17 * voxelsizex; fVar15 = fVar15 + voxelsizex)
      {
        for (fVar22 = fVar14 * voxelsizey; fVar22 < fVar18 * voxelsizey;
            fVar22 = fVar22 + voxelsizey) {
          for (fVar21 = fVar16 * voxelsizez; fVar21 < fVar19 * voxelsizez;
              fVar21 = fVar21 + voxelsizez) {
            saabb.min.field_0.v[2] = fVar21 - fVar20;
            saabb.max.field_0.v[2] = fVar20 + fVar21;
            saabb.min.field_0.v[0] = fVar15 - fVar23;
            saabb.min.field_0.v[1] = fVar22 - fVar13;
            saabb.max.field_0.v[0] = fVar23 + fVar15;
            saabb.max.field_0.v[1] = fVar13 + fVar22;
            boxcenter = (anon_struct_12_3_4e92e0dd_for_anon_union_12_2_12391dad_for_vx_vertex_0_1)
                        vx__aabb_center(&saabb);
            vVar24 = vx__aabb_half_size(&saabb);
            halfboxsize.field_0._0_4_ = vVar24.field_0._0_4_ + precision;
            halfboxsize.field_0._4_4_ = vVar24.field_0._4_4_ + precision;
            halfboxsize.field_0._8_4_ = vVar24.field_0._8_4_ + precision;
            triangle_00.p2.field_0.v[0] = triangle.p2.field_0.v[0];
            triangle_00.p1.field_0.v[2] = triangle.p1.field_0.v[2];
            triangle_00.p2.field_0.v[2] = triangle.p2.field_0.v[2];
            triangle_00.p2.field_0.v[1] = triangle.p2.field_0.v[1];
            triangle_00.p1.field_0._0_8_ = triangle.p1.field_0._0_8_;
            triangle_00.p3.field_0._0_8_ = triangle.p3.field_0._0_8_;
            triangle_00.p3.field_0.v[2] = triangle.p3.field_0.v[2];
            iVar2 = vx__triangle_box_overlap((vx_vertex_t)boxcenter,halfboxsize,triangle_00);
            if (iVar2 != 0) {
              data = (anon_union_12_2_12391dad_for_vx_vertex_0 *)malloc(0xc);
              data->field_1 = boxcenter;
              sVar3 = vx__vertex_hash((vx_vertex_t)boxcenter,0x1000);
              bVar1 = vx__hash_table_insert(table,sVar3,data,vx__vertex_comp_func);
              lVar10 = lVar10 + (ulong)bVar1;
            }
          }
        }
      }
    }
  }
  mesh = (vx_mesh_t *)malloc(0x38);
  mesh->nnormals = 6;
  pvVar4 = (vx_vertex_t *)calloc(lVar10 * 0x60,1);
  mesh->vertices = pvVar4;
  pvVar4 = (vx_vertex_t *)calloc(0x48,1);
  mesh->normals = pvVar4;
  puVar5 = (uint *)calloc(lVar10 * 0x90,1);
  mesh->indices = puVar5;
  puVar5 = (uint *)calloc(lVar10 * 0x90,1);
  mesh->normalindices = puVar5;
  mesh->nindices = 0;
  mesh->nvertices = 0;
  pfVar7 = vx_normals;
  for (lVar10 = 0x12; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pvVar4->field_0).v[0] = *pfVar7;
    pfVar7 = pfVar7 + (ulong)bVar11 * -2 + 1;
    pvVar4 = (vx_vertex_t *)((long)pvVar4 + (ulong)bVar11 * -8 + 4);
  }
  local_98 = -fVar23;
  local_88 = -fVar13;
  fStack_54 = -fVar20;
  uStack_60 = CONCAT44(fVar23,fVar20) ^ 0x8000000080000000;
  local_68 = CONCAT44(fVar13,fVar23) ^ 0x80000000;
  sVar3 = table->size;
  local_94 = fVar13;
  fStack_90 = fVar20;
  local_8c = local_98;
  local_84 = fVar20;
  local_80 = fVar23;
  local_7c = local_88;
  local_78 = fVar20;
  local_74 = fVar23;
  local_70 = fVar13;
  fStack_6c = fVar20;
  local_58 = local_88;
  local_50 = fVar23;
  local_4c = local_88;
  fStack_48 = fStack_54;
  local_44 = fVar23;
  local_40 = fVar13;
  local_3c = fStack_54;
  for (sVar8 = 0; sVar8 != sVar3; sVar8 = sVar8 + 1) {
    for (pvVar9 = table->elements[sVar8]; pvVar9 != (vx_hash_table_node_t *)0x0;
        pvVar9 = pvVar9->next) {
      vx__add_voxel(mesh,(vx_vertex_t *)pvVar9->data,&local_98);
    }
  }
  vx__hash_table_free(table,true);
  return mesh;
}

Assistant:

vx_mesh_t* vx_voxelize(vx_mesh_t* m,
    float voxelsizex,
    float voxelsizey,
    float voxelsizez,
    float precision)
{
    vx_mesh_t* outmesh = NULL;
    vx_hash_table_t* table = NULL;
    size_t voxels = 0;

    float halfsizex = voxelsizex * 0.5f;
    float halfsizey = voxelsizey * 0.5f;
    float halfsizez = voxelsizez * 0.5f;

    table = vx__hash_table_alloc(VOXELIZER_HASH_TABLE_SIZE);

    for (int i = 0; i < m->nindices; i += 3) {
        vx_triangle_t triangle;

        VX_ASSERT(m->indices[i+0] < m->nvertices);
        VX_ASSERT(m->indices[i+1] < m->nvertices);
        VX_ASSERT(m->indices[i+2] < m->nvertices);

        triangle.p1 = m->vertices[m->indices[i+0]];
        triangle.p2 = m->vertices[m->indices[i+1]];
        triangle.p3 = m->vertices[m->indices[i+2]];

        if (vx__triangle_area(&triangle) < VOXELIZER_EPSILON) {
            // triangle with 0 area
            continue;
        }

        vx_aabb_t aabb = vx__triangle_aabb(&triangle);

        aabb.min.x = vx__map_to_voxel(aabb.min.x, voxelsizex, true);
        aabb.min.y = vx__map_to_voxel(aabb.min.y, voxelsizey, true);
        aabb.min.z = vx__map_to_voxel(aabb.min.z, voxelsizez, true);

        aabb.max.x = vx__map_to_voxel(aabb.max.x, voxelsizex, false);
        aabb.max.y = vx__map_to_voxel(aabb.max.y, voxelsizey, false);
        aabb.max.z = vx__map_to_voxel(aabb.max.z, voxelsizez, false);

        for (float x = aabb.min.x; x < aabb.max.x; x += voxelsizex) {
            for (float y = aabb.min.y; y < aabb.max.y; y += voxelsizey) {
                for (float z = aabb.min.z; z < aabb.max.z; z += voxelsizez) {
                    vx_aabb_t saabb;

                    saabb.min.x = x - halfsizex;
                    saabb.min.y = y - halfsizey;
                    saabb.min.z = z - halfsizez;
                    saabb.max.x = x + halfsizex;
                    saabb.max.y = y + halfsizey;
                    saabb.max.z = z + halfsizez;

                    vx_vertex_t boxcenter = vx__aabb_center(&saabb);
                    vx_vertex_t halfsize = vx__aabb_half_size(&saabb);

                    // HACK: some holes might appear, this
                    // precision factor reduces the artifact
                    halfsize.x += precision;
                    halfsize.y += precision;
                    halfsize.z += precision;

                    if (vx__triangle_box_overlap(boxcenter, halfsize, triangle)) {
                        vx_vertex_t* nodedata = VX_MALLOC(vx_vertex_t, 1);
                        *nodedata = boxcenter;

                        size_t hash = vx__vertex_hash(boxcenter, VOXELIZER_HASH_TABLE_SIZE);

                        bool insert = vx__hash_table_insert(table,
                                hash,
                                nodedata,
                                vx__vertex_comp_func);

                        if (insert) {
                            voxels++;
                        }
                   }
                }
            }
        }
    }

    outmesh = VX_MALLOC(vx_mesh_t, 1);
    size_t nvertices = voxels * 8;
    size_t nindices = voxels * VOXELIZER_INDICES_SIZE;
    outmesh->nnormals = VOXELIZER_NORMAL_INDICES_SIZE;
    outmesh->vertices = VX_CALLOC(vx_vertex_t, nvertices);
    outmesh->normals = VX_CALLOC(vx_vertex_t, 6);
    outmesh->indices = VX_CALLOC(unsigned int, nindices);
    outmesh->normalindices = VX_CALLOC(unsigned int, nindices);
    outmesh->nindices = 0;
    outmesh->nvertices = 0;

    memcpy(outmesh->normals, vx_normals, 18 * sizeof(float));

    float vertices[24] = {
        -halfsizex,  halfsizey,  halfsizez,
        -halfsizex, -halfsizey,  halfsizez,
         halfsizex, -halfsizey,  halfsizez,
         halfsizex,  halfsizey,  halfsizez,
        -halfsizex,  halfsizey, -halfsizez,
        -halfsizex, -halfsizey, -halfsizez,
         halfsizex, -halfsizey, -halfsizez,
         halfsizex,  halfsizey, -halfsizez,
    };

    for (size_t i = 0; i < table->size; ++i) {
        if (table->elements[i] != NULL) {
            vx_hash_table_node_t* node = table->elements[i];

            if (!node) {
                continue;
            }

            vx_vertex_t* p = (vx_vertex_t*) node->data;
            vx__add_voxel(outmesh, p, vertices);

            while (node->next) {
                node = node->next;
                p = (vx_vertex_t*) node->data;
                vx__add_voxel(outmesh, p, vertices);
            }
        }
    }

    vx__hash_table_free(table, true);

    return outmesh;
}